

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double __x;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 local_c8;
  
  dVar1 = rho_a + rho_b;
  dVar2 = cbrt(dVar1);
  dVar10 = 2.4814019635975995 / dVar2;
  dVar3 = SQRT(dVar10);
  local_c8 = dVar3;
  if (dVar10 < 0.0) {
    local_c8 = sqrt(dVar10);
  }
  if (dVar10 < 0.0) {
    dVar3 = sqrt(dVar10);
  }
  dVar3 = dVar3 * dVar3 * dVar3;
  dVar13 = 1.5393389262365056 / (dVar2 * dVar2);
  dVar4 = log(16.081979498692537 /
              (dVar13 * 0.123235 + dVar3 * 0.204775 + local_c8 * 3.79785 + dVar10 * 0.8969) + 1.0);
  dVar11 = rho_a - rho_b;
  dVar5 = dVar1 * dVar1;
  dVar14 = (1.0 / dVar1) * dVar11;
  __x = dVar14 + 1.0;
  dVar6 = cbrt(1e-15);
  dVar7 = cbrt(__x);
  dVar12 = dVar6 * 1e-15;
  dVar1 = dVar12;
  if (1e-15 < __x) {
    dVar1 = __x * dVar7;
  }
  dVar4 = (dVar10 * 0.053425 + 1.0) * 0.0621814 * dVar4;
  dVar14 = 1.0 - dVar14;
  dVar8 = cbrt(dVar14);
  if (1e-15 < dVar14) {
    dVar12 = dVar14 * dVar8;
  }
  dVar9 = log(32.16395899738507 /
              (dVar13 * 0.1562925 + dVar3 * 0.420775 + local_c8 * 7.05945 + dVar10 * 1.549425) + 1.0
             );
  dVar3 = log(29.608749977793437 /
              (dVar13 * 0.1241775 + dVar3 * 0.1100325 + local_c8 * 5.1785 + dVar10 * 0.905775) + 1.0
             );
  dVar1 = (dVar1 + dVar12 + -2.0) * 1.9236610509315362;
  dVar3 = dVar3 * (dVar10 * 0.0278125 + 1.0);
  dVar6 = (double)(-(ulong)(dVar14 <= 1e-15) & (ulong)(dVar6 * dVar6) |
                  ~-(ulong)(dVar14 <= 1e-15) & (ulong)(dVar8 * dVar8)) * 0.5 +
          (double)(-(ulong)(__x <= 1e-15) & (ulong)(dVar6 * dVar6) |
                  ~-(ulong)(__x <= 1e-15) & (ulong)(dVar7 * dVar7)) * 0.5;
  dVar13 = sigma_ab + sigma_ab + sigma_aa + sigma_bb;
  dVar3 = ((dVar3 * -0.0197516734986138 + (dVar10 * 0.05137 + 1.0) * -0.0310907 * dVar9 + dVar4) *
           dVar1 * (1.0 / (dVar5 * dVar5)) * dVar11 * dVar11 * dVar11 * dVar11 - dVar4) +
          dVar3 * dVar1 * 0.0197516734986138;
  dVar1 = dVar6 * dVar6;
  dVar10 = exp((1.0 / (dVar6 * dVar1)) * dVar3 * -32.16396844291482);
  dVar10 = 1.0 / (dVar10 + -1.0);
  auVar15._8_8_ = dVar1 * dVar1;
  auVar15._0_8_ = dVar1;
  auVar15 = divpd(_DAT_01041040,auVar15);
  auVar16._0_8_ =
       dVar13 * ((1.0 / dVar2) / dVar5) * 1.2599210498948732 *
       auVar15._0_8_ * 2.080083823051904 * 2.3248947030192535;
  auVar16._8_8_ =
       dVar10 * 32.16396844291482 * 0.06672455060314922 * dVar13 * dVar13 *
       ((1.0 / (dVar2 * dVar2)) / (dVar5 * dVar5)) * 1.5874010519681996 * auVar15._8_8_ *
       7.795554179441513;
  auVar15 = divpd(auVar16,_DAT_010411e0);
  dVar2 = auVar15._8_8_ + auVar15._0_8_;
  dVar2 = log((1.0 / (dVar10 * 2.1461263399673647 * dVar2 + 1.0)) * 32.16396844291482 *
              dVar2 * 0.06672455060314922 + 1.0);
  *eps = dVar2 * dVar6 * dVar1 * 0.031090690869654894 + dVar3;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t56 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t19 = t1 * t1;
    constexpr double t20 = t3 * t3;
    constexpr double t21 = t19 * t20;
    constexpr double t110 = 0.1e1 / t3;
    constexpr double t111 = t110 * t5;
    constexpr double t115 = BB * beta;
    constexpr double t116 = 0.1e1 / gamma;
    constexpr double t130 = t56 * t56;
    constexpr double t135 = 0.1e1 / t20;
    constexpr double t136 = t1 * t135;
    constexpr double t137 = t136 * t6;
    constexpr double t143 = beta * t116;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t11 = t4 * t6 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t5 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = rho_a - rho_b;
    const double t35 = t34 * t34;
    const double t36 = t35 * t35;
    const double t37 = t7 * t7;
    const double t38 = t37 * t37;
    const double t39 = 0.1e1 / t38;
    const double t40 = t36 * t39;
    const double t41 = 0.1e1 / t7;
    const double t42 = t34 * t41;
    const double t43 = 0.1e1 + t42;
    const double t44 = t43 <= zeta_tol;
    const double t45 = safe_math::cbrt( zeta_tol );
    const double t46 = t45 * zeta_tol;
    const double t47 = safe_math::cbrt( t43 );
    const double t48 = t47 * t43;
    const double t49 = piecewise_functor_3( t44, t46, t48 );
    const double t50 = 0.1e1 - t42;
    const double t51 = t50 <= zeta_tol;
    const double t52 = safe_math::cbrt( t50 );
    const double t53 = t52 * t50;
    const double t54 = piecewise_functor_3( t51, t46, t53 );
    const double t55 = t49 + t54 - 0.2e1;
    const double t59 = 0.1e1 / ( 0.2e1 * t56 - 0.2e1 );
    const double t60 = t55 * t59;
    const double t62 = 0.1e1 + 0.5137e-1 * t11;
    const double t67 = 0.705945e1 * t14 + 0.1549425e1 * t11 + 0.420775e0 * t17 + 0.1562925e0 * t25;
    const double t70 = 0.1e1 + 0.32163958997385070134e2 / t67;
    const double t71 = safe_math::log( t70 );
    const double t75 = 0.1e1 + 0.278125e-1 * t11;
    const double t80 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t83 = 0.1e1 + 0.29608749977793437516e2 / t80;
    const double t84 = safe_math::log( t83 );
    const double t85 = t75 * t84;
    const double t87 = -0.310907e-1 * t62 * t71 + t33 - 0.19751673498613801407e-1 * t85;
    const double t88 = t60 * t87;
    const double t89 = t40 * t88;
    const double t91 = 0.19751673498613801407e-1 * t60 * t85;
    const double t92 = t45 * t45;
    const double t93 = t47 * t47;
    const double t94 = piecewise_functor_3( t44, t92, t93 );
    const double t95 = t52 * t52;
    const double t96 = piecewise_functor_3( t51, t92, t95 );
    const double t98 = t94 / 0.2e1 + t96 / 0.2e1;
    const double t99 = t98 * t98;
    const double t100 = t99 * t98;
    const double t101 = gamma * t100;
    const double t103 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t105 = 0.1e1 / t8 / t37;
    const double t106 = t103 * t105;
    const double t108 = 0.1e1 / t99;
    const double t112 = t108 * t19 * t111;
    const double t118 = ( -t33 + t89 + t91 ) * t116;
    const double t119 = 0.1e1 / t100;
    const double t121 = safe_math::exp( -t118 * t119 );
    const double t122 = t121 - 0.1e1;
    const double t123 = 0.1e1 / t122;
    const double t124 = t116 * t123;
    const double t125 = t103 * t103;
    const double t127 = t115 * t124 * t125;
    const double t129 = 0.1e1 / t22 / t38;
    const double t131 = t129 * t130;
    const double t132 = t99 * t99;
    const double t133 = 0.1e1 / t132;
    const double t134 = t131 * t133;
    const double t138 = t134 * t137;
    const double t141 = t106 * t56 * t112 / 0.96e2 + t127 * t138 / 0.3072e4;
    const double t142 = beta * t141;
    const double t146 = t143 * t123 * t141 + 0.1e1;
    const double t147 = 0.1e1 / t146;
    const double t148 = t116 * t147;
    const double t150 = t142 * t148 + 0.1e1;
    const double t151 = safe_math::log( t150 );
    const double t152 = t101 * t151;


    eps = -t33 + t89 + t91 + t152;

  }